

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O0

void __thiscall gss::LubyRestartsSchedule::did_a_restart(LubyRestartsSchedule *this)

{
  bool bVar1;
  _List_const_iterator<long_long> __first;
  reference plVar2;
  _List_node_base *in_RDI;
  _List_const_iterator<long_long> in_stack_ffffffffffffff88;
  _List_node_base *in_stack_ffffffffffffff90;
  _List_node_base *__x;
  iterator local_38;
  _List_const_iterator<long_long> local_30;
  iterator local_28;
  _List_const_iterator<long_long> in_stack_ffffffffffffffe0;
  _List_iterator<long_long> __last;
  const_iterator __position;
  
  __last._M_node = in_RDI[2]._M_prev;
  __position._M_node = in_RDI;
  __first = std::next<std::_List_const_iterator<long_long>>(in_stack_ffffffffffffff88,0x1374cb);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<long_long,_std::allocator<long_long>_>::end
                 (in_stack_ffffffffffffff88._M_node);
  std::_List_const_iterator<long_long>::_List_const_iterator
            ((_List_const_iterator<long_long> *)&stack0xffffffffffffffe0,&local_28);
  bVar1 = std::operator==((_Self *)&stack0xfffffffffffffff0,(_Self *)&stack0xffffffffffffffe0);
  if (bVar1) {
    in_stack_ffffffffffffff90 = in_RDI + 1;
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<long_long,_std::allocator<long_long>_>::end
                   (in_stack_ffffffffffffff88._M_node);
    std::_List_const_iterator<long_long>::_List_const_iterator(&local_30,&local_38);
    std::__cxx11::list<long_long,_std::allocator<long_long>_>::begin
              ((list<long_long,_std::allocator<long_long>_> *)in_stack_ffffffffffffff88._M_node);
    std::__cxx11::list<long_long,_std::allocator<long_long>_>::end
              ((list<long_long,_std::allocator<long_long>_> *)in_stack_ffffffffffffff88._M_node);
    std::__cxx11::list<long_long,std::allocator<long_long>>::
    insert<std::_List_iterator<long_long>,void>
              ((list<long_long,_std::allocator<long_long>_> *)in_stack_ffffffffffffffe0._M_node,
               __position,(_List_iterator<long_long>)__first._M_node,__last);
    __x = in_RDI + 1;
    std::__cxx11::list<long_long,_std::allocator<long_long>_>::back
              ((list<long_long,_std::allocator<long_long>_> *)in_stack_ffffffffffffff90);
    std::__cxx11::list<long_long,_std::allocator<long_long>_>::push_back
              ((list<long_long,_std::allocator<long_long>_> *)in_RDI,(value_type_conflict2 *)__x);
  }
  std::_List_const_iterator<long_long>::operator++
            ((_List_const_iterator<long_long> *)&in_RDI[2]._M_prev);
  plVar2 = std::_List_const_iterator<long_long>::operator*
                     ((_List_const_iterator<long_long> *)in_stack_ffffffffffffff90);
  in_RDI->_M_prev = (_List_node_base *)*plVar2;
  return;
}

Assistant:

auto LubyRestartsSchedule::did_a_restart() -> void
{
    if (next(_current_sequence) == _sequence.end()) {
        _sequence.insert(_sequence.end(), _sequence.begin(), _sequence.end());
        _sequence.push_back(_sequence.back() * 2);
    }
    ++_current_sequence;
    _backtracks_remaining = *_current_sequence;
}